

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_listener.c
# Opt level: O0

apx_clientEventListener_t * apx_clientEventListener_clone(apx_clientEventListener_t *other)

{
  apx_clientEventListener_t *self;
  apx_clientEventListener_t *other_local;
  
  if (other == (apx_clientEventListener_t *)0x0) {
    other_local = (apx_clientEventListener_t *)0x0;
  }
  else {
    other_local = (apx_clientEventListener_t *)malloc(0x20);
    if (other_local != (apx_clientEventListener_t *)0x0) {
      other_local->arg = other->arg;
      other_local->client_connect1 = other->client_connect1;
      other_local->client_disconnect1 = other->client_disconnect1;
      other_local->require_port_write1 = other->require_port_write1;
    }
  }
  return other_local;
}

Assistant:

apx_clientEventListener_t *apx_clientEventListener_clone(apx_clientEventListener_t *other)
{
   if (other != 0)
   {
      apx_clientEventListener_t *self = (apx_clientEventListener_t*) malloc(sizeof(apx_clientEventListener_t));
      if (self != 0)
      {
         *self = *other;
      }
      return self;
   }
   return (apx_clientEventListener_t*) 0;
}